

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManStop(Fx_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *pVVar1;
  Hsh_VecMan_t *__ptr_01;
  Vec_Flt_t *__ptr_02;
  Vec_Que_t *__ptr_03;
  long lVar2;
  long lVar3;
  
  __ptr = p->vLits;
  if (0 < __ptr->nCap) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar3);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray->nCap + lVar3) = 0;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < __ptr->nCap);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  pVVar1 = p->vCounts;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr_01 = p->pHash;
  pVVar1 = __ptr_01->vTable;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = __ptr_01->vData;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = __ptr_01->vMap;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  free(__ptr_01);
  __ptr_02 = p->vWeights;
  if (__ptr_02->pArray != (float *)0x0) {
    free(__ptr_02->pArray);
    __ptr_02->pArray = (float *)0x0;
  }
  if (__ptr_02 != (Vec_Flt_t *)0x0) {
    free(__ptr_02);
  }
  __ptr_03 = p->vPrio;
  if (__ptr_03->pOrder != (int *)0x0) {
    free(__ptr_03->pOrder);
    __ptr_03->pOrder = (int *)0x0;
  }
  if (__ptr_03->pHeap != (int *)0x0) {
    free(__ptr_03->pHeap);
    __ptr_03->pHeap = (int *)0x0;
  }
  if (__ptr_03 != (Vec_Que_t *)0x0) {
    free(__ptr_03);
  }
  pVVar1 = p->vVarCube;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLevels;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCubesS;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCubesD;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCompls;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCubeFree;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vDiv;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSCC;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Fx_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Fx_ManStop( Fx_Man_t * p )
{
//    Vec_WecFree( p->vCubes );
    Vec_WecFree( p->vLits );
    Vec_IntFree( p->vCounts );
    Hsh_VecManStop( p->pHash );
    Vec_FltFree( p->vWeights );
    Vec_QueFree( p->vPrio );
    Vec_IntFree( p->vVarCube );
    Vec_IntFree( p->vLevels );
    // temporary data
    Vec_IntFree( p->vCubesS );
    Vec_IntFree( p->vCubesD );
    Vec_IntFree( p->vCompls );
    Vec_IntFree( p->vCubeFree );
    Vec_IntFree( p->vDiv );
    Vec_IntFree( p->vSCC );
    ABC_FREE( p );
}